

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::
ParseTableDelimiters<flatbuffers::Parser::ParseFlexBufferValue(flexbuffers::Builder*)::__0>
          (Parser *this,size_t *fieldn,StructDef *struct_def,anon_class_16_2_29deed5a body)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  size_type_conflict sVar4;
  const_reference ppFVar5;
  size_type_conflict sVar6;
  Builder **ppBVar7;
  int t;
  bool local_ca;
  allocator<char> local_c9;
  string local_c8 [38];
  byte local_a2;
  byte local_a1;
  byte local_a0;
  byte local_9f;
  byte local_9e;
  byte local_9d;
  allocator<char> local_89;
  string local_88 [32];
  string local_68 [8];
  string name;
  char local_39;
  bool is_nested_vector;
  char terminator;
  StructDef *struct_def_local;
  size_t *fieldn_local;
  Parser *this_local;
  anon_class_16_2_29deed5a body_local;
  CheckedError *ce;
  
  this_local = body.this;
  ppBVar7 = body.builder;
  local_39 = '}';
  local_ca = false;
  body_local.this = this;
  if (ppBVar7 != (Builder **)0x0) {
    local_ca = Is((Parser *)fieldn,0x5b);
  }
  t = (int)fieldn;
  if (local_ca == false) {
    name.field_2._M_local_buf[0xf] = '\0';
    Expect(this,t);
    bVar2 = CheckedError::Check((CheckedError *)this);
    if (bVar2) {
      name.field_2._M_local_buf[0xf] = '\x01';
    }
    if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (bVar2) goto LAB_0012e3cb;
  }
  else {
    Next(this);
    bVar2 = CheckedError::Check((CheckedError *)this);
    if (bVar2) goto LAB_0012e3cb;
    CheckedError::~CheckedError((CheckedError *)this);
    local_39 = ']';
  }
  do {
    if ((((*(byte *)((long)fieldn + 0x3ea) & 1) == 0) ||
        (*(long *)&(struct_def->super_Definition).name == 0)) &&
       (bVar2 = Is((Parser *)fieldn,(int)local_39), bVar2)) goto LAB_0012e275;
    std::__cxx11::string::string(local_68);
    if (local_ca == false) {
      std::__cxx11::string::operator=(local_68,(string *)(fieldn + 5));
      bVar2 = Is((Parser *)fieldn,0x101);
      if (bVar2) {
        local_9d = 0;
        Next(this);
        cVar3 = CheckedError::Check((CheckedError *)this);
        if ((bool)cVar3) {
          local_9d = 1;
        }
        if ((local_9d & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
      }
      else {
        local_9e = 0;
        Expect(this,t);
        cVar3 = CheckedError::Check((CheckedError *)this);
        if ((bool)cVar3) {
          local_9e = 1;
        }
        if ((local_9e & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
      }
      if (!(bool)cVar3) {
        if (((fieldn[0xa9] & 1) == 0) ||
           ((bVar2 = Is((Parser *)fieldn,0x7b), !bVar2 &&
            (bVar2 = Is((Parser *)fieldn,0x5b), !bVar2)))) {
          local_9f = 0;
          Expect(this,t);
          cVar3 = CheckedError::Check((CheckedError *)this);
          if ((bool)cVar3) {
            local_9f = 1;
          }
          if ((local_9f & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if ((bool)cVar3) goto LAB_0012e237;
        }
LAB_0012e13e:
        local_a0 = 0;
        ParseFlexBufferValue::anon_class_16_2_29deed5a::operator()
                  ((anon_class_16_2_29deed5a *)this,(string *)&this_local,(size_t *)local_68,
                   struct_def);
        cVar3 = CheckedError::Check((CheckedError *)this);
        if ((bool)cVar3) {
          local_a0 = 1;
        }
        if ((local_a0 & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (!(bool)cVar3) {
          bVar2 = Is((Parser *)fieldn,(int)local_39);
          if (bVar2) {
            cVar3 = '\x02';
          }
          else {
            local_a1 = 0;
            ParseComma(this);
            cVar3 = CheckedError::Check((CheckedError *)this);
            if ((bool)cVar3) {
              local_a1 = 1;
            }
            if ((local_a1 & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (!(bool)cVar3) {
              cVar3 = '\0';
            }
          }
        }
      }
    }
    else {
      uVar1 = *(ulong *)&(struct_def->super_Definition).name;
      sVar4 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::size
                        ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          *)(ppBVar7 + 0x1f));
      if (uVar1 < sVar4) {
        ppFVar5 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                  operator[]((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                              *)(ppBVar7 + 0x1f),
                             *(size_type_conflict *)&(struct_def->super_Definition).name);
        std::__cxx11::string::operator=(local_68,(string *)*ppFVar5);
        goto LAB_0012e13e;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_88,"too many unnamed fields in nested array",&local_89);
      Error(this,(string *)fieldn);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator(&local_89);
      cVar3 = '\x01';
    }
LAB_0012e237:
    std::__cxx11::string::~string(local_68);
  } while (cVar3 == '\0');
  if (cVar3 != '\x01') {
LAB_0012e275:
    local_a2 = 0;
    Next(this);
    bVar2 = CheckedError::Check((CheckedError *)this);
    if (bVar2) {
      local_a2 = 1;
    }
    if ((local_a2 & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (!bVar2) {
      if ((local_ca == false) ||
         (sVar4 = *(size_type_conflict *)&(struct_def->super_Definition).name,
         sVar6 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                 size((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                      (ppBVar7 + 0x1f)), sVar4 == sVar6)) {
        anon_unknown_0::NoError();
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_c8,"wrong number of unnamed fields in table vector",&local_c9);
        Error(this,(string *)fieldn);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator(&local_c9);
      }
    }
  }
LAB_0012e3cb:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseTableDelimiters(size_t &fieldn,
                                          const StructDef *struct_def, F body) {
  // We allow tables both as JSON object{ .. } with field names
  // or vector[..] with all fields in order
  char terminator = '}';
  bool is_nested_vector = struct_def && Is('[');
  if (is_nested_vector) {
    NEXT();
    terminator = ']';
  } else {
    EXPECT('{');
  }
  for (;;) {
    if ((!opts.strict_json || !fieldn) && Is(terminator)) break;
    std::string name;
    if (is_nested_vector) {
      if (fieldn >= struct_def->fields.vec.size()) {
        return Error("too many unnamed fields in nested array");
      }
      name = struct_def->fields.vec[fieldn]->name;
    } else {
      name = attribute_;
      if (Is(kTokenStringConstant)) {
        NEXT();
      } else {
        EXPECT(opts.strict_json ? kTokenStringConstant : kTokenIdentifier);
      }
      if (!opts.protobuf_ascii_alike || !(Is('{') || Is('['))) EXPECT(':');
    }
    ECHECK(body(name, fieldn, struct_def));
    if (Is(terminator)) break;
    ECHECK(ParseComma());
  }
  NEXT();
  if (is_nested_vector && fieldn != struct_def->fields.vec.size()) {
    return Error("wrong number of unnamed fields in table vector");
  }
  return NoError();
}